

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

JavascriptPromise *
Js::JavascriptPromise::InitializePromise_TTD
          (ScriptContext *scriptContext,uint32 status,bool isHandled,Var result,
          SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *resolveReactions
          ,SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *rejectReactions
          )

{
  JavascriptPromiseReaction *pJVar1;
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *pSVar2;
  code *pcVar3;
  JavascriptPromiseReaction *pJVar4;
  Recycler *pRVar5;
  bool bVar6;
  JavascriptPromise *pJVar7;
  Recycler *alloc;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *addr;
  undefined4 *puVar8;
  Type *ppJVar9;
  undefined7 in_register_00000011;
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *pSVar10;
  Type *addr_00;
  undefined1 local_90 [8];
  JavascriptPromiseReactionPair pair;
  TrackAllocData data;
  Iterator local_48;
  Recycler *local_38;
  
  local_38 = scriptContext->recycler;
  pJVar7 = JavascriptLibrary::CreatePromise
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  pJVar7->status = (Type)status;
  if ((int)CONCAT71(in_register_00000011,isHandled) != 0) {
    pJVar7->isHandled = true;
  }
  Memory::Recycler::WBSetBit((char *)&pJVar7->result);
  (pJVar7->result).ptr = result;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pJVar7->result);
  pRVar5 = local_38;
  pair.rejectReaction =
       (JavascriptPromiseReaction *)
       &SList<Js::JavascriptPromiseReactionPair,Memory::Recycler,RealCount>::typeinfo;
  alloc = Memory::Recycler::TrackAllocInfo(local_38,(TrackAllocData *)&pair.rejectReaction);
  addr = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
         new<Memory::Recycler>(0x18,alloc,0x387914);
  (addr->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>).
  super_SListNodeBase<Memory::Recycler> = 0;
  ((RealCount *)
  ((long)&addr->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> + 8)
  )->count = 0;
  Memory::Recycler::WBSetBit((char *)addr);
  *(SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> **)
   &addr->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> = addr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  ((RealCount *)
  ((long)&addr->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> + 8)
  )->count = 0;
  addr->allocator = pRVar5;
  addr_00 = &pJVar7->reactions;
  Memory::Recycler::WBSetBit((char *)addr_00);
  (pJVar7->reactions).ptr = addr;
  local_38 = (Recycler *)pJVar7;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  data.typeinfo =
       (type_info *)
       (resolveReactions->
       super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>).
       super_SListNodeBase<Memory::HeapAllocator>.next;
  pair.rejectReaction = (JavascriptPromiseReaction *)resolveReactions;
  local_48.list =
       &rejectReactions->
        super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>;
  if ((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)data.typeinfo ==
      resolveReactions) {
    pSVar10 = (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)0x0;
    local_48.current =
         (rejectReactions->
         super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>).
         super_SListNodeBase<Memory::HeapAllocator>.next;
    bVar6 = (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
            local_48.current != rejectReactions;
    if (!bVar6) {
      local_48.current = (NodeBase *)pSVar10;
    }
LAB_00cf1f0e:
    if (((char)pSVar10 == '\0') && (!bVar6)) goto LAB_00cf1f67;
  }
  else {
    pSVar10 = (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
              (rejectReactions->
              super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>).
              super_SListNodeBase<Memory::HeapAllocator>.next;
    local_48.current =
         (NodeBase *)(SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)0x0
    ;
    if (pSVar10 != rejectReactions) {
      local_48.current = (NodeBase *)pSVar10;
    }
    if (pSVar10 != rejectReactions &&
        (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)data.typeinfo !=
        resolveReactions) {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        ppJVar9 = SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::
                  Iterator::Data((Iterator *)&pair.rejectReaction);
        local_90 = (undefined1  [8])*ppJVar9;
        ppJVar9 = SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::
                  Iterator::Data(&local_48);
        pair.resolveReaction = *ppJVar9;
        SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Prepend
                  (&addr_00->ptr->
                    super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>,
                   addr_00->ptr->allocator,(JavascriptPromiseReactionPair *)local_90);
        if (data.typeinfo == (type_info *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                      ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar6) goto LAB_00cf1f86;
          *puVar8 = 0;
        }
        pJVar4 = pair.rejectReaction;
        pJVar1 = *(JavascriptPromiseReaction **)data.typeinfo;
        data.typeinfo = (type_info *)(JavascriptPromiseReaction *)0x0;
        if (pJVar1 != pair.rejectReaction) {
          data.typeinfo = (type_info *)pJVar1;
        }
        pSVar10 = (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
                  (ulong)(pJVar1 != pair.rejectReaction);
        if ((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
            local_48.current ==
            (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                      ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar6) goto LAB_00cf1f86;
          *puVar8 = 0;
        }
        pSVar2 = (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
                 (((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
                  local_48.current)->
                 super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>)
                 .super_SListNodeBase<Memory::HeapAllocator>.next;
        bVar6 = pSVar2 != (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>
                           *)local_48.list;
        local_48.current =
             (NodeBase *)
             (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)0x0;
        if (bVar6) {
          local_48.current = (NodeBase *)pSVar2;
        }
      } while ((pJVar1 != pJVar4) &&
              (pSVar2 != (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *
                         )local_48.list));
      goto LAB_00cf1f0e;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar8 = 1;
  bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                              ,0x730,"(hasResolve == false && hasReject == false)",
                              "mismatched resolve/reject reaction counts");
  if (!bVar6) {
LAB_00cf1f86:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar8 = 0;
LAB_00cf1f67:
  pRVar5 = local_38;
  SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Reverse
            (&((Type *)&local_38->threadService)->ptr->
              super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>);
  return (JavascriptPromise *)pRVar5;
}

Assistant:

JavascriptPromise* JavascriptPromise::InitializePromise_TTD(ScriptContext* scriptContext, uint32 status, bool isHandled, Var result, SList<Js::JavascriptPromiseReaction*, HeapAllocator>& resolveReactions,SList<Js::JavascriptPromiseReaction*, HeapAllocator>& rejectReactions)
    {
        Recycler* recycler = scriptContext->GetRecycler();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        JavascriptPromise* promise = library->CreatePromise();

        promise->SetStatus((PromiseStatus)status);
        if (isHandled)
        {
            promise->SetIsHandled();
        }
        promise->result = result;

        promise->reactions = RecyclerNew(recycler, JavascriptPromiseReactionList, recycler);
        SList<Js::JavascriptPromiseReaction*, HeapAllocator>::Iterator resolveIterator = resolveReactions.GetIterator();
        SList<Js::JavascriptPromiseReaction*, HeapAllocator>::Iterator rejectIterator = rejectReactions.GetIterator();

        bool hasResolve = resolveIterator.Next();
        bool hasReject = rejectIterator.Next();
        while (hasResolve && hasReject)
        {
            JavascriptPromiseReactionPair pair;
            pair.resolveReaction = resolveIterator.Data();
            pair.rejectReaction = rejectIterator.Data();
            promise->reactions->Prepend(pair);
            hasResolve = resolveIterator.Next();
            hasReject = rejectIterator.Next();
        }
        AssertMsg(hasResolve == false && hasReject == false, "mismatched resolve/reject reaction counts");
        promise->reactions->Reverse();

        return promise;
    }